

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O1

bool __thiscall
gmlc::containers::
DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::
addSearchTerm(DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
              *this,string_view searchValue,InterfaceHandle *existingValue)

{
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar2;
  byte bVar3;
  long lVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar8;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_str = searchValue._M_str;
  local_28._M_len = searchValue._M_len;
  p_Var6 = (this->lookup2)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->lookup2)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = &p_Var1->_M_header;
  if (p_Var6 != (_Base_ptr)0x0) {
    do {
      if (existingValue->hid <= (int)p_Var6[1]._M_color) {
        p_Var5 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < existingValue->hid];
    } while (p_Var6 != (_Base_ptr)0x0);
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
     (p_Var6 = p_Var5, existingValue->hid < (int)p_Var5[1]._M_color)) {
    p_Var6 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    bVar3 = 0;
  }
  else {
    StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>> *)
               &this->names,&local_28);
    lVar4 = (long)(this->names).bsize;
    ppbVar2 = (this->names).dataptr;
    if (lVar4 == 0) {
      pbVar7 = ppbVar2[((this->names).csize >> 5) - 1] + 0x1f;
    }
    else {
      pbVar7 = ppbVar2[(this->names).dataSlotIndex] + lVar4 + -1;
    }
    pVar8 = std::
            _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::__cxx11::string&,unsigned_long&>
                      ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&this->lookup1,pbVar7,&p_Var6[1]._M_parent);
    bVar3 = pVar8.second;
  }
  return (bool)(bVar3 & 1);
}

Assistant:

auto addSearchTerm(
            std::string_view searchValue,
            const searchType2& existingValue)
        {
            auto fnd = lookup2.find(existingValue);
            if (fnd != lookup2.end()) {
                names.emplace_back(searchValue);
                auto res = lookup1.emplace(names.back(), fnd->second);
                return res.second;
            }
            return false;
        }